

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# asn.cpp
# Opt level: O1

void asn1::dumpDER(MemBuffer *mb,int level,int offset)

{
  byte *pbVar1;
  pair<int,_int> pVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  long lVar4;
  pointer puVar5;
  uint uVar6;
  size_t __n;
  undefined8 *puVar7;
  char *pcVar8;
  int size;
  ulong uVar9;
  uint uVar10;
  char local_f8 [8];
  char spaces [70];
  undefined1 local_a8 [8];
  unsigned_short t;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_98;
  MemBuffer local_88;
  int local_60;
  int local_5c;
  undefined1 local_58 [8];
  MemBuffer mb2;
  
  puVar7 = &DAT_00190740;
  pcVar8 = local_f8;
  local_60 = offset;
  for (lVar4 = 8; lVar4 != 0; lVar4 = lVar4 + -1) {
    *(undefined8 *)pcVar8 = *puVar7;
    puVar7 = puVar7 + 1;
    pcVar8 = pcVar8 + 8;
  }
  builtin_strncpy(spaces + 0x38,"     ",6);
  mb2.readpos._4_4_ = level;
  spaces[(long)level * 4 + -8] = '\0';
  uVar9 = mb->readpos;
  if (uVar9 < (ulong)((long)(mb->data).
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_finish -
                     (long)(mb->data).
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                           .super__Vector_impl_data._M_start)) {
    mb2.readpos._4_4_ = mb2.readpos._4_4_ + 1;
    do {
      uVar6 = (int)uVar9 + local_60;
      pVar2 = MemBuffer::readDERHead(mb);
      uVar9 = (ulong)pVar2 >> 0x20;
      local_5c = (int)mb->readpos;
      size = pVar2.second;
      MemBuffer::readBuffer((MemBuffer *)local_58,mb,size);
      uVar10 = pVar2.first;
      printf("%04x : %s%02x %04x : ",(ulong)uVar6,local_f8,(ulong)pVar2 & 0xffffffff,uVar9);
      if ((uVar10 & 0xfffffffb) == 0x13) {
        MemBuffer::readString_abi_cxx11_((string *)local_a8,(MemBuffer *)local_58,size);
        printf("\"%s\" \n",CONCAT44(local_a8._4_4_,CONCAT22(local_a8._2_2_,local_a8._0_2_)));
        paVar3 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)CONCAT44(local_a8._4_4_,CONCAT22(local_a8._2_2_,local_a8._0_2_));
        if (paVar3 != &local_98) {
          uVar9 = local_98._M_allocated_capacity + 1;
LAB_00172e69:
          operator_delete(paVar3,uVar9);
        }
      }
      else if ((uVar10 - 3 < 2) || (uVar10 == 6)) {
        if (size != 0 && -1 < (long)pVar2) {
          do {
            pbVar1 = (byte *)((long)local_58 +
                             (long)mb2.data.
                                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                   ._M_impl.super__Vector_impl_data._M_end_of_storage);
            mb2.data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage =
                 mb2.data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage + 1;
            printf("%02x ",(ulong)*pbVar1);
            uVar6 = (int)uVar9 - 1;
            uVar9 = (ulong)uVar6;
          } while (uVar6 != 0);
        }
        putchar(10);
      }
      else if (uVar10 == 2) {
        if (size == 4) {
          puVar5 = (pointer)((long)local_58 +
                            (long)mb2.data.
                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage) + 3;
          lVar4 = 0;
          do {
            local_a8[lVar4] = *puVar5;
            lVar4 = lVar4 + 1;
            puVar5 = puVar5 + -1;
          } while (lVar4 != 4);
          mb2.data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage =
               mb2.data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage + 4;
          uVar9 = (ulong)CONCAT22(local_a8._2_2_,local_a8._0_2_);
        }
        else if (size == 2) {
          puVar5 = (pointer)((long)local_58 +
                            (long)mb2.data.
                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage) + 1;
          lVar4 = 0;
          do {
            local_a8[lVar4] = *puVar5;
            lVar4 = lVar4 + 1;
            puVar5 = puVar5 + -1;
          } while (lVar4 == 1);
          mb2.data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage =
               mb2.data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage + 2;
          uVar9 = (ulong)(ushort)local_a8._0_2_;
        }
        else {
          uVar9 = 0;
          if (size == 1) {
            uVar9 = (ulong)*(byte *)((long)local_58 +
                                    (long)mb2.data.
                                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                          ._M_impl.super__Vector_impl_data._M_end_of_storage);
            mb2.data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage =
                 mb2.data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage + 1;
          }
        }
        printf("%x\n",uVar9);
      }
      else if ((int)uVar10 < 0x30) {
        if (uVar10 == 5) {
          pcVar8 = "NULL";
        }
        else {
          pcVar8 = "<data>";
        }
        puts(pcVar8);
      }
      else {
        putchar(10);
        local_88.data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        local_88.data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        local_88.data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        uVar9 = (long)mb2.data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_start - (long)local_58;
        if (uVar9 == 0) {
          paVar3 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)0x0;
        }
        else {
          if ((long)uVar9 < 0) {
            std::__throw_bad_alloc();
          }
          paVar3 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)operator_new(uVar9);
        }
        local_88.data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)(paVar3->_M_local_buf + uVar9);
        __n = (long)mb2.data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start - (long)local_58;
        local_88.data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)paVar3;
        if (__n != 0) {
          local_88.data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)paVar3;
          memmove(paVar3,(void *)local_58,__n);
        }
        local_88.data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)(paVar3->_M_local_buf + __n);
        local_88.readpos =
             (uint64_t)
             mb2.data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
        dumpDER(&local_88,mb2.readpos._4_4_,local_5c);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_88.data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
               _M_impl.super__Vector_impl_data._M_start !=
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)0x0) {
          uVar9 = (long)local_88.data.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage -
                  (long)local_88.data.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_start;
          paVar3 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)local_88.data.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start;
          goto LAB_00172e69;
        }
      }
      if (local_58 != (undefined1  [8])0x0) {
        operator_delete((void *)local_58,
                        (long)mb2.data.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_finish - (long)local_58);
      }
      uVar9 = mb->readpos;
    } while (uVar9 < (ulong)((long)(mb->data).
                                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                   ._M_impl.super__Vector_impl_data._M_finish -
                            (long)(mb->data).
                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                  _M_impl.super__Vector_impl_data._M_start));
  }
  return;
}

Assistant:

void dumpDER(MemBuffer mb, int level, int offset)
{
    char spaces[] =
        "                                                                     ";
    spaces[level * 4] = 0;
    while (!mb.done()) {
        unsigned int offs = mb.pos() + offset;
        auto p = mb.readDERHead();
        int o = mb.pos();
        MemBuffer mb2 = mb.readBuffer(p.second);
        printf("%04x : %s%02x %04x : ", offs, spaces, p.first, p.second);

        if (p.first == 0x13 || p.first == 0x17) {
            printf("\"%s\" \n", mb2.readString(p.second).c_str());
        } else if (p.first == 0x02) {
            unsigned v = 0;
            switch (p.second) {
            case 1:
                v = mb2.read<uint8_t>();
                break;
            case 2:
                v = mb2.read<uint16_t>();
                break;
            case 4:
                v = mb2.read<uint32_t>();
                break;
            }
            printf("%x\n", v);
        } else if (p.first == 03 || p.first == 4 || p.first == 6) {
            for (int i = 0; i < p.second; i++)
                printf("%02x ", mb2.read<uint8_t>());
            printf("\n");
        } else if (p.first >= 0x30) {
            printf("\n");
            dumpDER(mb2, level + 1, o);
        } else if (p.first == 5)
            printf("NULL\n");
        else
            printf("<data>\n");
    }
}